

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O2

void __thiscall tst_helpers_each::functorThrows(tst_helpers_each *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar3;
  bool bVar4;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<QList<int>_> *this_01;
  QPromiseReject<QList<int>_> *in_R8;
  initializer_list<int> args;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_170;
  PromiseResolver<QList<int>_> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_160;
  QPromiseBase<void> local_158;
  _Any_data local_148;
  undefined **local_138;
  PromiseData<QList<int>_> *local_130;
  QPromiseBase<QList<int>_> local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_110;
  PromiseResolver<void> resolver;
  QPromise<QList<int>_> p_1;
  QPromise<QList<int>_> p;
  function<void_()> local_c8;
  QArrayDataPointer<char16_t> local_a0;
  QPromiseBase<QList<int>_> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_58;
  undefined1 *local_34;
  undefined4 local_2c;
  
  local_34 = &DAT_2b0000002a;
  local_2c = 0x2c;
  args._M_len = 3;
  args._M_array = (iterator)&local_34;
  QList<int>::QList((QList<int> *)&local_a0,args);
  QtPromise::QPromise<QList<int>_>::resolve
            ((QPromise<QList<int>_> *)&local_88,(QList<int> *)&local_a0);
  p_1.super_QPromiseBase<QList<int>_>.m_d.d = local_88.m_d.d;
  if (local_88.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_88.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8
  ;
  local_158._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c670;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0013c628;
  local_158.m_d.d = (PromiseData<void> *)this_00;
  local_c8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_c8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_c8);
  QVar3 = p_1.super_QPromiseBase<QList<int>_>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_170.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_170.d = (Data *)resolver.m_d.d;
  }
  local_160.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_170.d != (Data *)0x0) {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_148._M_unused._0_8_ = resolver.m_d.d;
  local_148._8_8_ = local_170.d;
  local_128._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_148._M_unused._M_object;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_138._0_1_;
  pcStack_60 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_148._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar3 = p_1.super_QPromiseBase<QList<int>_>.m_d;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_58,(PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<void> *)&local_170,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_160);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_158._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c628;
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
                super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  local_128.m_d.d = p_1.super_QPromiseBase<QList<int>_>.m_d.d;
  if (p_1.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c498;
  this_01 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<int>_>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0013c4c8;
  p.super_QPromiseBase<QList<int>_>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&resolver);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&resolver);
  QVar2.d = local_158.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_170.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_170 = resolver_1.m_d.d;
  }
  local_160.d = (Data *)0x0;
  if (local_170.d == (Data *)0x0) {
    local_148._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_148._8_8_ = local_170.d;
  }
  local_118.d = (Data *)0x0;
  if (local_170.d != (Data *)0x0) {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_148._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_148._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130 = local_128.m_d.d;
  if (local_128.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138 = &PTR__QPromiseBase_0013c4c8;
  local_c8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_c8._M_invoker = (_Invoker_type)0x0;
  local_148._M_unused._0_8_ = (undefined8)local_170.d;
  local_110.d = (Data *)local_148._8_8_;
  local_c8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_c8.super__Function_base._M_functor._M_unused._0_8_ = local_148._M_unused._M_object
  ;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0013c498;
  *(PromiseData<QList<int>_> **)
   ((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_130;
  if (local_130 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_130->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0013c4c8;
  local_c8._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<QList<int>>::tap<QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda()#1}(QList<int>const&)#1}>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda()#1}(QList<int>const&)#1})const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromiseBase<QList<int>>::tap<QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda()#1}(QList<int>const&)#1}>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::functorThrows()::$_0>(tst_helpers_each::functorThrows()::$_0)::{lambda()#1}(QList<int>const&)#1})const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_148._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_c8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  QVar2.d = local_158.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_148,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_170,
             (QPromiseResolve<QList<int>_> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_110);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_160);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_158.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_158.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_128);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_158);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p_1.super_QPromiseBase<QList<int>_>);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_88);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_a0);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  waitForError<QList<int>,QString>((QString *)&local_a0,&p,(QString *)&resolver);
  QString::QString((QString *)&p_1,"foo");
  QTest::qCompare((QString *)&local_a0,(QString *)&p_1,"waitForError(p, QString{})",
                  "QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                  ,0x85);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  return;
}

Assistant:

void tst_helpers_each::functorThrows()
{
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [](int v, ...) {
        if (v == 44) {
            throw QString{"foo"};
        }
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
}